

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
::
copy_or_move_from<google::dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>>
          (dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
           *this,dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                 *ht,size_type min_buckets_wanted)

{
  pointer ppVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined6 uVar5;
  undefined1 auVar6 [12];
  pair<const_HashObject<16,_16>,_int> *value;
  size_type new_num_buckets;
  pointer ppVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  short sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 uVar22;
  undefined2 uVar23;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::clear_to_size((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                   *)this,new_num_buckets);
  sVar3 = ht->num_buckets;
  ppVar7 = ht->table;
  ppVar1 = ppVar7 + sVar3;
  iVar9 = g_num_hashes;
  iVar8 = g_num_copies;
  if (sVar3 != 0) {
    lVar10 = sVar3 * 0x14;
    do {
      iVar14 = (ppVar7->first).i_;
      if (((ht->key_info).empty_key.i_ != iVar14) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey.i_ != iVar14)) break;
      ppVar7 = ppVar7 + 1;
      lVar10 = lVar10 + -0x14;
    } while (lVar10 != 0);
  }
  do {
    do {
      if (ppVar7 == ppVar1) {
        *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
        return;
      }
      iVar9 = iVar9 + 1;
      iVar14 = (ppVar7->first).i_;
      iVar15 = 0;
      iVar16 = 0;
      iVar17 = 0;
      lVar10 = 4;
      do {
        uVar2 = *(undefined4 *)((ppVar7->first).buffer_ + lVar10 + -4);
        uVar22 = (undefined1)((uint)uVar2 >> 0x18);
        uVar23 = CONCAT11(uVar22,uVar22);
        uVar22 = (undefined1)((uint)uVar2 >> 0x10);
        uVar4 = CONCAT35(CONCAT21(uVar23,uVar22),CONCAT14(uVar22,uVar2));
        uVar22 = (undefined1)((uint)uVar2 >> 8);
        uVar5 = CONCAT51(CONCAT41((int)((ulong)uVar4 >> 0x20),uVar22),uVar22);
        sVar18 = CONCAT11((char)uVar2,(char)uVar2);
        uVar12 = CONCAT62(uVar5,sVar18);
        auVar21._8_4_ = 0;
        auVar21._0_8_ = uVar12;
        auVar21._12_2_ = uVar23;
        auVar21._14_2_ = uVar23;
        uVar23 = (undefined2)((ulong)uVar4 >> 0x20);
        auVar20._12_4_ = auVar21._12_4_;
        auVar20._8_2_ = 0;
        auVar20._0_8_ = uVar12;
        auVar20._10_2_ = uVar23;
        auVar19._10_6_ = auVar20._10_6_;
        auVar19._8_2_ = uVar23;
        auVar19._0_8_ = uVar12;
        uVar23 = (undefined2)uVar5;
        auVar6._4_8_ = auVar19._8_8_;
        auVar6._2_2_ = uVar23;
        auVar6._0_2_ = uVar23;
        iVar14 = iVar14 + ((int)sVar18 >> 8);
        iVar15 = iVar15 + (auVar6._0_4_ >> 0x18);
        iVar16 = iVar16 + (auVar19._8_4_ >> 0x18);
        iVar17 = iVar17 + (auVar20._12_4_ >> 0x18);
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x10);
      lVar10 = *(long *)(this + 0x60);
      uVar12 = (long)(iVar17 + iVar15 + iVar16 + iVar14) & *(long *)(this + 0x50) - 1U;
      if (*(int *)(this + 0x30) != *(int *)(lVar10 + uVar12 * 0x14)) {
        lVar13 = 1;
        do {
          uVar12 = uVar12 + lVar13 & *(long *)(this + 0x50) - 1U;
          lVar13 = lVar13 + 1;
        } while (*(int *)(this + 0x30) != *(int *)(lVar10 + uVar12 * 0x14));
      }
      piVar11 = (int *)(lVar10 + uVar12 * 0x14);
      iVar8 = iVar8 + 1;
      g_num_hashes = iVar9;
      g_num_copies = iVar8;
      *piVar11 = (ppVar7->first).i_;
      *(undefined8 *)(piVar11 + 1) = *(undefined8 *)(ppVar7->first).buffer_;
      piVar11[3] = *(int *)((ppVar7->first).buffer_ + 8);
      piVar11[4] = ppVar7->second;
      *(long *)(this + 0x48) = *(long *)(this + 0x48) + 1;
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 == ppVar1);
    do {
      iVar14 = (ppVar7->first).i_;
      if (((ht->key_info).empty_key.i_ != iVar14) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey.i_ != iVar14)) break;
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar1);
  } while( true );
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }